

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall FIX::SocketMonitor::~SocketMonitor(SocketMonitor *this)

{
  bool bVar1;
  reference piVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<int> local_18;
  iterator i;
  SocketMonitor *this_local;
  
  this->_vptr_SocketMonitor = (_func_int **)&PTR__SocketMonitor_00331708;
  i._M_node = (_Base_ptr)this;
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->m_readSockets);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_readSockets);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_18);
    socket_close(*piVar2);
    std::_Rb_tree_const_iterator<int>::operator++(&local_18);
  }
  socket_close(this->m_signal);
  socket_term();
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue(&this->m_dropped);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->m_writeSockets);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->m_readSockets);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->m_connectSockets);
  return;
}

Assistant:

SocketMonitor::~SocketMonitor() {
  Sockets::iterator i;
  for (i = m_readSockets.begin(); i != m_readSockets.end(); ++i) {
    socket_close(*i);
  }

  socket_close(m_signal);
  socket_term();
}